

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

IceTVoid * rtsi_generateDataFunc(IceTInt id,IceTInt dest,IceTSizeType *size)

{
  IceTInt *pIVar1;
  IceTInt rank;
  IceTVoid *outBuffer;
  
  pIVar1 = icetUnsafeStateGetInteger(0x87);
  icetGetIntegerv(2,&rank);
  if (rank == dest) {
    icetGetCompressedTileImage(pIVar1[id],rtsi_workingImage);
    *size = 0;
    outBuffer = (IceTVoid *)0x0;
  }
  else {
    icetGetCompressedTileImage(pIVar1[id],rtsi_outSparseImage);
    icetSparseImagePackageForSend(rtsi_outSparseImage,&outBuffer,size);
  }
  return outBuffer;
}

Assistant:

static IceTVoid *rtsi_generateDataFunc(IceTInt id, IceTInt dest,
                                       IceTSizeType *size) {
    IceTInt rank;
    const IceTInt *tile_list
        = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    IceTVoid *outBuffer;

    icetGetIntegerv(ICET_RANK, &rank);
    if (dest == rank) {
      /* Special case: sending to myself.
         Just get directly to color and depth buffers. */
        icetGetCompressedTileImage(tile_list[id], rtsi_workingImage);
        *size = 0;
        return NULL;
    }
    icetGetCompressedTileImage(tile_list[id], rtsi_outSparseImage);
    icetSparseImagePackageForSend(rtsi_outSparseImage, &outBuffer, size);
    return outBuffer;
}